

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O2

void __thiscall pbrt::ProgressReporter::~ProgressReporter(ProgressReporter *this)

{
  Done(this);
  std::thread::~thread(&this->updateThread);
  std::__cxx11::string::~string((string *)&this->title);
  return;
}

Assistant:

ProgressReporter::~ProgressReporter() {
    Done();
}